

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *field)

{
  pointer pTVar1;
  ulong uVar2;
  string *__args;
  size_type sVar3;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_60;
  type local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
  local_50;
  Binding local_48;
  type local_20;
  TypeEntry *type;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *field_local;
  Module *this_local;
  
  type = (TypeEntry *)field;
  field_local = (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
                this;
  pTVar1 = std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
           operator->(field);
  local_20 = std::unique_ptr<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>::operator*
                       (&pTVar1->type);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __args = &local_20->name;
    pTVar1 = std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
             operator->(field);
    sVar3 = std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::size(&this->types);
    Binding::Binding(&local_48,
                     &(pTVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
                      loc,(Index)sVar3);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
         ::emplace<std::__cxx11::string&,wabt::Binding>
                   ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                     *)&this->type_bindings,__args,&local_48);
  }
  local_58 = local_20;
  std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::push_back
            (&this->types,&local_58);
  std::unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>>::
  unique_ptr<wabt::TypeModuleField,std::default_delete<wabt::TypeModuleField>,void>
            ((unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>> *)&local_60,field
            );
  intrusive_list<wabt::ModuleField>::push_back(&this->fields,&local_60);
  std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::~unique_ptr
            (&local_60);
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<TypeModuleField> field) {
  TypeEntry& type = *field->type;
  if (!type.name.empty()) {
    type_bindings.emplace(type.name, Binding(field->loc, types.size()));
  }
  types.push_back(&type);
  fields.push_back(std::move(field));
}